

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operators.hpp
# Opt level: O3

string * __thiscall
viennamath::op_unary<viennamath::op_log10<double>,viennamath::rt_expression_interface<double>>::
str_abi_cxx11_(op_unary<viennamath::op_log10<double>,_viennamath::rt_expression_interface<double>_>
               *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  *(undefined4 *)&in_RDI->field_2 = 0x31676f6c;
  *(undefined2 *)((long)&in_RDI->field_2 + 4) = 0x30;
  in_RDI->_M_string_length = 5;
  return in_RDI;
}

Assistant:

std::string str() const { return unary_op_.str(); }